

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O3

FT_Error tt_set_mm_blend(TT_Face face,FT_UInt num_coords,FT_Fixed *coords,FT_Bool set_design_coords)

{
  FT_Stream stream;
  GX_Blend pGVar1;
  GX_AVarCorrespondence pGVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  FT_UShort FVar6;
  ushort uVar7;
  FT_Error FVar8;
  FT_Fixed *pFVar9;
  FT_ULong FVar10;
  FT_ULong *pFVar11;
  FT_Long FVar12;
  FT_Fixed *pFVar13;
  FT_ULong FVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  FT_MM_Var *pFVar20;
  ulong uVar21;
  undefined4 uVar22;
  FT_Memory memory;
  long lVar23;
  GX_AVarSegment av;
  GX_AVarSegment pGVar24;
  GX_Blend pGVar25;
  uint uVar26;
  ulong uVar27;
  FT_Error error;
  FT_Error error_1;
  FT_ULong table_len;
  FT_Error local_98;
  FT_Error local_94;
  GX_Blend local_90;
  FT_MM_Var *local_88;
  FT_Memory local_80;
  long local_78;
  long local_70;
  ushort local_68;
  ushort local_66;
  long local_60;
  ushort local_58;
  byte local_56;
  long local_50;
  TT_Face local_48;
  ulong local_40;
  ulong local_38;
  
  local_98 = 0;
  memory = (face->root).memory;
  face->doblend = '\0';
  pGVar25 = face->blend;
  if (pGVar25 == (GX_Blend)0x0) {
    FVar8 = TT_Get_MM_Var(face,(FT_MM_Var **)0x0);
    if (FVar8 != 0) {
      return FVar8;
    }
    pGVar25 = face->blend;
  }
  local_98 = 0;
  pFVar20 = pGVar25->mmvar;
  if (pFVar20->num_axis < num_coords) {
    num_coords = pFVar20->num_axis;
  }
  uVar27 = (ulong)num_coords;
  if (num_coords != 0) {
    uVar15 = 0;
    do {
      if (coords[uVar15] - 0x10001U < 0xfffffffffffdffff) {
        return 6;
      }
      uVar15 = uVar15 + 1;
    } while (num_coords != uVar15);
  }
  if ((face->is_cff2 == '\0') && (pGVar25->glyphoffsets == (FT_ULong *)0x0)) {
    stream = (face->root).stream;
    pGVar1 = (GX_Blend)stream->memory;
    local_88 = pFVar20;
    local_80 = memory;
    local_94 = (*face->goto_table)(face,0x67766172,stream,&local_38);
    if (local_94 != 0) {
      return local_94;
    }
    local_90 = pGVar1;
    FVar10 = FT_Stream_Pos(stream);
    local_94 = FT_Stream_ReadFields(stream,(FT_Frame_Field *)ft_var_load_gvar_gvar_fields,&local_70)
    ;
    if (local_94 != 0) {
      return local_94;
    }
    if (local_70 != 0x10000) {
      return 8;
    }
    if (local_68 != (ushort)pGVar25->mmvar->num_axis) {
      return 8;
    }
    if (local_38 >> 1 <= (ulong)local_68 * (ulong)local_66 &&
        (ulong)local_68 * (ulong)local_66 - (local_38 >> 1) != 0) {
      return 8;
    }
    if (local_38 < (ulong)local_58 << (local_56 & 1) + 1) {
      return 8;
    }
    pGVar25->gvar_size = local_38;
    pGVar25->tuplecount = (uint)local_66;
    pGVar25->gv_glyphcnt = (uint)local_58;
    local_78 = local_50 + FVar10;
    pFVar11 = (FT_ULong *)
              ft_mem_realloc((FT_Memory)local_90,8,0,(ulong)local_58 + 1,(void *)0x0,&local_94);
    pGVar25->glyphoffsets = pFVar11;
    if (local_94 != 0) {
      return local_94;
    }
    uVar15 = (ulong)(pGVar25->gv_glyphcnt + 1);
    local_48 = face;
    local_40 = uVar27;
    if ((local_56 & 1) == 0) {
      FVar8 = FT_Stream_EnterFrame(stream,uVar15 * 2);
      lVar23 = local_78;
      if (FVar8 != 0) {
        return FVar8;
      }
      uVar27 = 0;
      local_94 = 0;
      do {
        FVar6 = FT_Stream_GetUShort(stream);
        pGVar25->glyphoffsets[uVar27] = lVar23 + (ulong)FVar6 * 2;
        uVar18 = (int)uVar27 + 1;
        uVar27 = (ulong)uVar18;
      } while (uVar18 <= pGVar25->gv_glyphcnt);
    }
    else {
      FVar8 = FT_Stream_EnterFrame(stream,uVar15 << 2);
      lVar23 = local_78;
      if (FVar8 != 0) {
        return FVar8;
      }
      uVar27 = 0;
      local_94 = 0;
      do {
        FVar14 = FT_Stream_GetULong(stream);
        pGVar25->glyphoffsets[uVar27] = FVar14 + lVar23;
        uVar18 = (int)uVar27 + 1;
        uVar27 = (ulong)uVar18;
      } while (uVar18 <= pGVar25->gv_glyphcnt);
    }
    FT_Stream_ExitFrame(stream);
    if (pGVar25->tuplecount != 0) {
      pFVar9 = (FT_Fixed *)
               ft_mem_realloc((FT_Memory)local_90,8,0,(ulong)(pGVar25->tuplecount * (uint)local_68),
                              (void *)0x0,&local_94);
      pGVar25->tuplecoords = pFVar9;
      if (local_94 != 0) {
        return local_94;
      }
      local_90 = pGVar25;
      local_94 = FT_Stream_Seek(stream,FVar10 + local_60);
      if (local_94 != 0) {
        return local_94;
      }
      FVar8 = FT_Stream_EnterFrame(stream,(ulong)((uint)local_68 * local_90->tuplecount) * 2);
      pGVar25 = local_90;
      if (FVar8 != 0) {
        return FVar8;
      }
      uVar18 = local_90->tuplecount;
      local_94 = 0;
      if (uVar18 != 0) {
        uVar17 = 0;
        uVar7 = local_68;
        do {
          uVar26 = 0;
          if (uVar7 == 0) {
            uVar7 = 0;
          }
          else {
            do {
              FVar6 = FT_Stream_GetUShort(stream);
              pGVar25->tuplecoords[uVar17 * local_68 + uVar26] = (long)((int)(short)FVar6 << 2);
              uVar26 = uVar26 + 1;
            } while (uVar26 < local_68);
            uVar18 = pGVar25->tuplecount;
            uVar7 = local_68;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < uVar18);
      }
      FT_Stream_ExitFrame(stream);
      pGVar25 = local_90;
    }
    local_98 = local_94;
    face = local_48;
    pFVar20 = local_88;
    memory = local_80;
    uVar27 = local_40;
    if (local_94 != 0) {
      return local_94;
    }
  }
  local_80 = (FT_Memory)pGVar25->coords;
  if (local_80 == (FT_Memory)0x0) {
    pFVar9 = (FT_Fixed *)ft_mem_realloc(memory,8,0,(ulong)pFVar20->num_axis,(void *)0x0,&local_98);
    pGVar25->coords = pFVar9;
    if (local_98 != 0) {
      return local_98;
    }
  }
  pFVar9 = pGVar25->normalizedcoords;
  if (pFVar9 == (FT_Fixed *)0x0) {
    pFVar9 = (FT_Fixed *)ft_mem_realloc(memory,8,0,(ulong)pFVar20->num_axis,(void *)0x0,&local_98);
    pGVar25->normalizedcoords = pFVar9;
    if (local_98 != 0) {
      return local_98;
    }
    uVar18 = pFVar20->num_axis;
    local_88 = (FT_MM_Var *)CONCAT44(local_88._4_4_,1);
  }
  else {
    if ((int)uVar27 == 0) {
      uVar15 = 0;
    }
    else {
      uVar15 = 0;
      do {
        if (pFVar9[uVar15] != coords[uVar15]) {
          bVar5 = true;
          bVar4 = true;
          uVar22 = 2;
          goto LAB_0016cf60;
        }
        uVar15 = uVar15 + 1;
      } while ((uVar27 & 0xffffffff) != uVar15);
      uVar15 = uVar27 & 0xffffffff;
    }
    uVar22 = 0;
    bVar5 = false;
    bVar4 = false;
LAB_0016cf60:
    uVar19 = (face->root).face_index;
    uVar18 = pFVar20->num_axis;
    uVar17 = (uint)uVar15;
    if ((uVar19 & 0x7fff0000) == 0) {
      if (uVar17 < uVar18) {
        uVar19 = uVar15 & 0xffffffff;
        do {
          if (pFVar9[uVar19] != 0) {
            bVar4 = true;
          }
          uVar19 = uVar19 + 1;
        } while (uVar18 != (uint)uVar19);
      }
    }
    else if (uVar17 < uVar18) {
      uVar21 = uVar15 & 0xffffffff;
      bVar4 = bVar5;
      do {
        if (pFVar9[uVar21] !=
            pGVar25->normalized_stylecoords[((uint)uVar19 >> 0x10) * uVar18 + uVar21]) {
          bVar4 = true;
        }
        uVar21 = uVar21 + 1;
      } while (uVar18 != (uint)uVar21);
    }
    if (!bVar4) {
      return -1;
    }
    if (uVar17 < uVar18) {
      uVar15 = uVar15 & 0xffffffff;
      do {
        if (pFVar9[uVar15] != 0) {
          local_88 = (FT_MM_Var *)CONCAT44(local_88._4_4_,2);
          goto LAB_0016cff4;
        }
        uVar15 = uVar15 + 1;
      } while (uVar18 != uVar15);
    }
    local_88 = (FT_MM_Var *)CONCAT44(local_88._4_4_,uVar22);
  }
LAB_0016cff4:
  pGVar25->num_axis = uVar18;
  memcpy(pFVar9,coords,(uVar27 & 0xffffffff) << 3);
  if (set_design_coords != '\0') {
    if (local_80 == (FT_Memory)0x0) {
      uVar27 = (ulong)pGVar25->num_axis;
    }
    pFVar9 = pGVar25->coords;
    local_90 = face->blend;
    uVar18 = local_90->num_axis;
    uVar17 = (uint)uVar27;
    uVar27 = uVar27 & 0xffffffff;
    if (uVar18 < uVar17) {
      uVar27 = (ulong)uVar18;
    }
    uVar26 = (uint)uVar27;
    if (uVar26 != 0) {
      pFVar13 = pGVar25->normalizedcoords;
      uVar15 = 0;
      do {
        pFVar9[uVar15] = pFVar13[uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar27 != uVar15);
    }
    local_80 = memory;
    if (uVar18 < uVar17) {
      memset(pFVar9 + uVar27,0,(ulong)(uVar17 + ~uVar26) * 8 + 8);
    }
    pGVar24 = local_90->avar_segment;
    if (uVar26 != 0 && pGVar24 != (GX_AVarSegment)0x0) {
      uVar15 = 0;
      do {
        if (1 < pGVar24->pairCount) {
          pGVar2 = pGVar24->correspondence;
          lVar23 = 0;
          do {
            lVar16 = *(long *)((long)&pGVar2[1].toCoord + lVar23);
            if (pFVar9[uVar15] < lVar16) {
              lVar3 = *(long *)((long)&pGVar2->toCoord + lVar23);
              FVar12 = FT_MulDiv(pFVar9[uVar15] - lVar3,
                                 *(long *)((long)&pGVar2[1].fromCoord + lVar23) -
                                 *(long *)((long)&pGVar2->fromCoord + lVar23),lVar16 - lVar3);
              pFVar9[uVar15] =
                   FVar12 + *(long *)((long)&pGVar24->correspondence->fromCoord + lVar23);
              break;
            }
            lVar23 = lVar23 + 0x10;
          } while ((ulong)pGVar24->pairCount * 0x10 + -0x10 != lVar23);
        }
        uVar15 = uVar15 + 1;
        pGVar24 = pGVar24 + 1;
      } while (uVar15 != uVar27);
    }
    memory = local_80;
    if (uVar26 != 0) {
      pFVar13 = &local_90->mmvar->axis->maximum;
      uVar15 = 0;
      do {
        lVar23 = pFVar9[uVar15];
        if (lVar23 < 0) {
          lVar23 = (long)((int)pFVar13[-1] - (int)pFVar13[-2]) * (long)(int)lVar23;
          lVar16 = (long)(int)((ulong)((lVar23 >> 0x3f) + lVar23 + 0x8000) >> 0x10) + pFVar13[-1];
        }
        else {
          lVar16 = pFVar13[-1];
          if (lVar23 != 0) {
            lVar23 = (long)((int)*pFVar13 - (int)lVar16) * (long)(int)lVar23;
            lVar16 = lVar16 + (int)((ulong)((lVar23 >> 0x3f) + lVar23 + 0x8000) >> 0x10);
          }
        }
        pFVar9[uVar15] = lVar16;
        uVar15 = uVar15 + 1;
        pFVar13 = pFVar13 + 6;
      } while (uVar27 != uVar15);
    }
  }
  face->doblend = '\x01';
  if (face->cvt != (FT_Short *)0x0) {
    if ((int)local_88 == 1) {
      local_98 = tt_face_vary_cvt(face,(face->root).stream);
    }
    else if ((int)local_88 == 2) {
      ft_mem_free(memory,face->cvt);
      face->cvt = (FT_Short *)0x0;
      local_98 = tt_face_load_cvt(face,(face->root).stream);
    }
  }
  ft_mem_free(memory,face->postscript_name);
  face->postscript_name = (char *)0x0;
  return local_98;
}

Assistant:

static FT_Error
  tt_set_mm_blend( TT_Face    face,
                   FT_UInt    num_coords,
                   FT_Fixed*  coords,
                   FT_Bool    set_design_coords )
  {
    FT_Error    error = FT_Err_Ok;
    GX_Blend    blend;
    FT_MM_Var*  mmvar;
    FT_UInt     i;

    FT_Bool     all_design_coords = FALSE;

    FT_Memory   memory = face->root.memory;

    enum
    {
      mcvt_retain,
      mcvt_modify,
      mcvt_load

    } manageCvt;


    face->doblend = FALSE;

    if ( !face->blend )
    {
      if ( FT_SET_ERROR( TT_Get_MM_Var( face, NULL ) ) )
        goto Exit;
    }

    blend = face->blend;
    mmvar = blend->mmvar;

    if ( num_coords > mmvar->num_axis )
    {
      FT_TRACE2(( "TT_Set_MM_Blend:"
                  " only using first %d of %d coordinates\n",
                  mmvar->num_axis, num_coords ));
      num_coords = mmvar->num_axis;
    }

    FT_TRACE5(( "normalized design coordinates:\n" ));

    for ( i = 0; i < num_coords; i++ )
    {
      FT_TRACE5(( "  %.5f\n", coords[i] / 65536.0 ));
      if ( coords[i] < -0x00010000L || coords[i] > 0x00010000L )
      {
        FT_TRACE1(( "TT_Set_MM_Blend: normalized design coordinate %.5f\n"
                    "                 is out of range [-1;1]\n",
                    coords[i] / 65536.0 ));
        error = FT_THROW( Invalid_Argument );
        goto Exit;
      }
    }

    FT_TRACE5(( "\n" ));

    if ( !face->is_cff2 && !blend->glyphoffsets )
      if ( FT_SET_ERROR( ft_var_load_gvar( face ) ) )
        goto Exit;

    if ( !blend->coords )
    {
      if ( FT_NEW_ARRAY( blend->coords, mmvar->num_axis ) )
        goto Exit;

      /* the first time we have to compute all design coordinates */
      all_design_coords = TRUE;
    }

    if ( !blend->normalizedcoords )
    {
      if ( FT_NEW_ARRAY( blend->normalizedcoords, mmvar->num_axis ) )
        goto Exit;

      manageCvt = mcvt_modify;

      /* If we have not set the blend coordinates before this, then the  */
      /* cvt table will still be what we read from the `cvt ' table and  */
      /* we don't need to reload it.  We may need to change it though... */
    }
    else
    {
      FT_Bool    have_diff = 0;
      FT_UInt    j;
      FT_Fixed*  c;
      FT_Fixed*  n;


      manageCvt = mcvt_retain;

      for ( i = 0; i < num_coords; i++ )
      {
        if ( blend->normalizedcoords[i] != coords[i] )
        {
          manageCvt = mcvt_load;
          have_diff = 1;
          break;
        }
      }

      if ( FT_IS_NAMED_INSTANCE( FT_FACE( face ) ) )
      {
        FT_UInt  idx = (FT_UInt)face->root.face_index >> 16;


        c = blend->normalizedcoords + i;
        n = blend->normalized_stylecoords + idx * mmvar->num_axis + i;
        for ( j = i; j < mmvar->num_axis; j++, n++, c++ )
          if ( *c != *n )
            have_diff = 1;
      }
      else
      {
        c = blend->normalizedcoords + i;
        for ( j = i; j < mmvar->num_axis; j++, c++ )
          if ( *c != 0 )
            have_diff = 1;
      }

      /* return value -1 indicates `no change' */
      if ( !have_diff )
        return -1;

      for ( ; i < mmvar->num_axis; i++ )
      {
        if ( blend->normalizedcoords[i] != 0 )
        {
          manageCvt = mcvt_load;
          break;
        }
      }

      /* If we don't change the blend coords then we don't need to do  */
      /* anything to the cvt table.  It will be correct.  Otherwise we */
      /* no longer have the original cvt (it was modified when we set  */
      /* the blend last time), so we must reload and then modify it.   */
    }

    blend->num_axis = mmvar->num_axis;
    FT_MEM_COPY( blend->normalizedcoords,
                 coords,
                 num_coords * sizeof ( FT_Fixed ) );

    if ( set_design_coords )
      ft_var_to_design( face,
                        all_design_coords ? blend->num_axis : num_coords,
                        blend->normalizedcoords,
                        blend->coords );

    face->doblend = TRUE;

    if ( face->cvt )
    {
      switch ( manageCvt )
      {
      case mcvt_load:
        /* The cvt table has been loaded already; every time we change the */
        /* blend we may need to reload and remodify the cvt table.         */
        FT_FREE( face->cvt );
        face->cvt = NULL;

        error = tt_face_load_cvt( face, face->root.stream );
        break;

      case mcvt_modify:
        /* The original cvt table is in memory.  All we need to do is */
        /* apply the `cvar' table (if any).                           */
        error = tt_face_vary_cvt( face, face->root.stream );
        break;

      case mcvt_retain:
        /* The cvt table is correct for this set of coordinates. */
        break;
      }
    }

    /* enforce recomputation of the PostScript name; */
    FT_FREE( face->postscript_name );
    face->postscript_name = NULL;

  Exit:
    return error;
  }